

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::ConfidentialTransactionContext::SplitTxOut
          (ConfidentialTransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *nonce_list)

{
  pointer pAVar1;
  undefined1 *puVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  CfdException *pCVar6;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  long lVar7;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range1;
  Amount *amount;
  pointer pAVar8;
  long lVar9;
  ulong uVar10;
  Amount total_amount;
  ConfidentialAssetId fee_asset;
  ByteData prev_tx;
  ConfidentialAssetId asset;
  ConfidentialTxOutReference ref;
  string local_210;
  undefined8 local_1f0;
  undefined1 local_1e8;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *local_1e0;
  ConfidentialAssetId local_1d8;
  undefined1 *local_1b0;
  size_t local_1a8;
  undefined1 local_1a0 [16];
  Script local_190;
  undefined8 local_158;
  undefined1 local_150;
  undefined8 local_148;
  undefined1 local_140;
  undefined1 local_138 [24];
  Script local_120;
  ConfidentialAssetId local_e8;
  ConfidentialValue local_c0 [3];
  undefined8 local_40;
  undefined1 local_38;
  
  local_1e0 = nonce_list;
  if ((SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
       ::kMinimumAmount == '\0') &&
     (iVar5 = __cxa_guard_acquire(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                                   ::kMinimumAmount), iVar5 != 0)) {
    cfd::core::Amount::Amount
              ((Amount *)
               &SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                ::kMinimumAmount,100);
    __cxa_guard_release(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                         ::kMinimumAmount);
  }
  pAVar8 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pAVar1 - (long)pAVar8 >> 4;
  if ((lVar7 != ((long)(locking_script_list->
                       super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(locking_script_list->
                       super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) ||
     (lVar7 != ((long)(local_1e0->
                      super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_1e0->
                      super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Unmatch each list count.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_138);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (pAVar8 == pAVar1) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"list is empty.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_138);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar3 = HasBlinding(this);
  if (bVar3) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Already blinded.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)local_138);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialTransaction::GetTxOut((uint)local_138);
  cfd::core::Script::Script(&local_190,&local_120);
  cVar4 = cfd::core::Script::IsEmpty();
  core::Script::~Script(&local_190);
  if (cVar4 != '\0') {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_190._vptr_Script =
         (_func_int **)
         ((long)&local_190.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Target is fee output.","")
    ;
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_190);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&local_190,&local_e8);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_1d8,local_c0);
  local_158 = cfd::core::ConfidentialValue::GetAmount();
  local_1d8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialValue_002b0e40;
  local_150 = extraout_DL;
  if (local_1d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::Amount::Amount((Amount *)&local_1f0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1d8);
  local_40 = GetFeeAmount(this,&local_1d8);
  local_38 = extraout_DL_00;
  cVar4 = cfd::core::operator>((Amount *)&local_40,0);
  if (cVar4 == '\0') {
    bVar3 = false;
  }
  else {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    puVar2 = local_1b0;
    if (local_210._M_string_length == local_1a8) {
      if (local_210._M_string_length == 0) {
        bVar3 = true;
      }
      else {
        iVar5 = bcmp(local_210._M_dataplus._M_p,local_1b0,local_210._M_string_length);
        bVar3 = iVar5 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (puVar2 != local_1a0) {
      operator_delete(puVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    local_1f0 = SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                ::kMinimumAmount;
    local_1e8 = DAT_002ba3c0;
  }
  pAVar8 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar8 != pAVar1) {
    do {
      cfd::core::Amount::operator+=((Amount *)&local_1f0,pAVar8);
      pAVar8 = pAVar8 + 0x10;
    } while (pAVar8 != pAVar1);
  }
  cVar4 = cfd::core::operator<((Amount *)&local_158,(Amount *)&local_1f0);
  if (cVar4 != '\0') {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"The Amount is too large.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_210);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (bVar3) {
    cfd::core::Amount::operator-=
              ((Amount *)&local_1f0,
               (Amount *)
               &SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                ::kMinimumAmount);
  }
  local_148 = cfd::core::operator-((Amount *)&local_158,(Amount *)&local_1f0);
  local_140 = extraout_DL_01;
  (**(code **)(*(long *)this + 0x40))(&local_1b0,this);
  cfd::core::ConfidentialTransaction::SetTxOutValue((uint)this,(Amount *)(ulong)index);
  if ((amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 0;
    lVar9 = 0;
    uVar10 = 0;
    do {
      cVar4 = cfd::core::Script::IsEmpty();
      if (cVar4 != '\0') {
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_210,"Locking script is empty.","");
        core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_210);
        __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      cfd::core::ConfidentialTransaction::AddTxOut
                ((Amount *)this,
                 (ConfidentialAssetId *)
                 ((amount_list->
                  super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl
                  .super__Vector_impl_data._M_start + lVar7),&local_190,
                 (ConfidentialNonce *)
                 ((long)&((locking_script_list->
                          super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar9));
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x38;
      lVar7 = lVar7 + 0x10;
    } while (uVar10 < (ulong)((long)(amount_list->
                                    super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(amount_list->
                                    super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (local_1b0 != (undefined1 *)0x0) {
    operator_delete(local_1b0);
  }
  local_1d8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002b0ea0;
  if (local_1d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_190._vptr_Script = (_func_int **)&PTR__ConfidentialAssetId_002b0ea0;
  if (local_190.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_138);
  return;
}

Assistant:

void ConfidentialTransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Script>& locking_script_list,
    const std::vector<ConfidentialNonce>& nonce_list) {
  static const Amount kMinimumAmount(int64_t{100});

  if ((amount_list.size() != locking_script_list.size()) ||
      (amount_list.size() != nonce_list.size())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch each list count.");
  } else if (amount_list.empty()) {
    throw CfdException(CfdError::kCfdIllegalArgumentError, "list is empty.");
  } else if (HasBlinding()) {
    throw CfdException(CfdError::kCfdIllegalStateError, "Already blinded.");
  }

  auto ref = GetTxOut(index);
  if (ref.GetLockingScript().IsEmpty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target is fee output.");
  }

  auto asset = ref.GetAsset();
  auto base_amount = ref.GetConfidentialValue().GetAmount();
  Amount total_amount;
  ConfidentialAssetId fee_asset;
  auto fee = GetFeeAmount(&fee_asset);
  bool has_fee_asset = false;
  if (fee > 0) {
    has_fee_asset = (asset.GetHex() == fee_asset.GetHex());
    total_amount = kMinimumAmount;
  }

  for (const auto& amount : amount_list) total_amount += amount;

  if (base_amount < total_amount) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "The Amount is too large.");
  }
  if (has_fee_asset) total_amount -= kMinimumAmount;
  Amount update_amount = base_amount - total_amount;

  ByteData prev_tx = GetData();
  try {
    SetTxOutValue(index, update_amount);
    for (size_t txout_idx = 0; txout_idx < amount_list.size(); ++txout_idx) {
      if (locking_script_list[txout_idx].IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Locking script is empty.");
      }
      AddTxOut(
          amount_list[txout_idx], asset, locking_script_list[txout_idx],
          nonce_list[txout_idx]);
    }
  } catch (const CfdException& except) {
    SetFromHex(prev_tx.GetHex());  // rollback
    throw except;
  }
}